

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O0

void __thiscall
defyx::AssemblyGeneratorX86::h_CBRANCH(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  ostream *poVar4;
  void *pvVar5;
  byte bVar6;
  uint uVar7;
  undefined4 in_EDX;
  Instruction *in_RSI;
  long in_RDI;
  uint j;
  int32_t imm;
  int shift;
  int target;
  int reg;
  uint local_28;
  
  uVar7 = (uint)in_RSI->dst;
  iVar1 = *(int *)(in_RDI + 0x188 + (long)(int)uVar7 * 4);
  iVar2 = Instruction::getModCond(in_RSI);
  bVar6 = (char)iVar2 + 8;
  uVar3 = Instruction::getImm32((Instruction *)0x116127);
  poVar4 = std::operator<<((ostream *)(in_RDI + 0x10),"\tadd ");
  poVar4 = std::operator<<(poVar4,*(char **)(regR + (long)(int)uVar7 * 8));
  poVar4 = std::operator<<(poVar4,", ");
  pvVar5 = (void *)std::ostream::operator<<
                             (poVar4,(uVar3 | (uint)(1L << (bVar6 & 0x3f))) &
                                     ((uint)(1L << ((char)iVar2 + 7U & 0x3f)) ^ 0xffffffff));
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)(in_RDI + 0x10),"\ttest ");
  poVar4 = std::operator<<(poVar4,*(char **)(regR + (long)(int)uVar7 * 8));
  poVar4 = std::operator<<(poVar4,", ");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,0xff << (bVar6 & 0x1f));
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)(in_RDI + 0x10),"\tjz defyx_isn_");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,iVar1 + 1);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
    *(undefined4 *)(in_RDI + 0x188 + (ulong)local_28 * 4) = in_EDX;
  }
  return;
}

Assistant:

void AssemblyGeneratorX86::h_CBRANCH(Instruction& instr, int i) {
		int reg = instr.dst;
		int target = registerUsage[reg] + 1;
		int shift = instr.getModCond() + ConditionOffset;
		int32_t imm = instr.getImm32() | (1L << shift);
		if (ConditionOffset > 0 || shift > 0)
			imm &= ~(1L << (shift - 1));
		asmCode << "\tadd " << regR[reg] << ", " << imm << std::endl;
		asmCode << "\ttest " << regR[reg] << ", " << (ConditionMask << shift) << std::endl;
		asmCode << "\tjz defyx_isn_" << target << std::endl;
		//mark all registers as used
		for (unsigned j = 0; j < RegistersCount; ++j) {
			registerUsage[j] = i;
		}
	}